

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::ELU_x86_fma::forward_inplace(ELU_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  float __x;
  uint uVar2;
  _func_int **pp_Var3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  undefined1 auVar7 [32];
  ulong uVar8;
  long lVar9;
  undefined1 (*pauVar10) [32];
  long lVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 extraout_var [60];
  
  iVar12 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->elempack;
  uVar14 = 0;
  uVar8 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar8 = uVar14;
  }
  pp_Var3 = this->_vptr_ELU_x86_fma;
  auVar37 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar42 = ZEXT3264(CONCAT428(0x3f000000,
                               CONCAT424(0x3f000000,
                                         CONCAT420(0x3f000000,
                                                   CONCAT416(0x3f000000,
                                                             CONCAT412(0x3f000000,
                                                                       CONCAT48(0x3f000000,
                                                                                0x3f0000003f000000))
                                                            )))));
  auVar44 = ZEXT3264(CONCAT428(0x3f800000,
                               CONCAT424(0x3f800000,
                                         CONCAT420(0x3f800000,
                                                   CONCAT416(0x3f800000,
                                                             CONCAT412(0x3f800000,
                                                                       CONCAT48(0x3f800000,
                                                                                0x3f8000003f800000))
                                                            )))));
  auVar49 = ZEXT3264(CONCAT428(0x395e8083,
                               CONCAT424(0x395e8083,
                                         CONCAT420(0x395e8083,
                                                   CONCAT416(0x395e8083,
                                                             CONCAT412(0x395e8083,
                                                                       CONCAT48(0x395e8083,
                                                                                0x395e8083395e8083))
                                                            )))));
  auVar50 = ZEXT3264(CONCAT428(0x3ab743ce,
                               CONCAT424(0x3ab743ce,
                                         CONCAT420(0x3ab743ce,
                                                   CONCAT416(0x3ab743ce,
                                                             CONCAT412(0x3ab743ce,
                                                                       CONCAT48(0x3ab743ce,
                                                                                0x3ab743ce3ab743ce))
                                                            )))));
  auVar51 = ZEXT3264(CONCAT428(0x39506967,
                               CONCAT424(0x39506967,
                                         CONCAT420(0x39506967,
                                                   CONCAT416(0x39506967,
                                                             CONCAT412(0x39506967,
                                                                       CONCAT48(0x39506967,
                                                                                0x3950696739506967))
                                                            )))));
  for (; uVar14 != uVar8; uVar14 = uVar14 + 1) {
    pvVar4 = bottom_top_blob->data;
    sVar5 = bottom_top_blob->elemsize;
    sVar6 = bottom_top_blob->cstep;
    pauVar10 = (undefined1 (*) [32])(sVar6 * uVar14 * sVar5 + (long)pvVar4);
    uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var3[-3]);
    auVar15._4_4_ = uVar1;
    auVar15._0_4_ = uVar1;
    auVar15._8_4_ = uVar1;
    auVar15._12_4_ = uVar1;
    auVar15._16_4_ = uVar1;
    auVar15._20_4_ = uVar1;
    auVar15._24_4_ = uVar1;
    auVar15._28_4_ = uVar1;
    lVar11 = 0;
    for (iVar13 = 0; iVar13 + 7 < iVar12; iVar13 = iVar13 + 8) {
      auVar20 = vminps_avx(*pauVar10,auVar37._0_32_);
      auVar26._8_4_ = 0x42b0c0a5;
      auVar26._0_8_ = 0x42b0c0a542b0c0a5;
      auVar26._12_4_ = 0x42b0c0a5;
      auVar26._16_4_ = 0x42b0c0a5;
      auVar26._20_4_ = 0x42b0c0a5;
      auVar26._24_4_ = 0x42b0c0a5;
      auVar26._28_4_ = 0x42b0c0a5;
      auVar20 = vminps_avx(auVar20,auVar26);
      auVar27._8_4_ = 0xc2b0c0a5;
      auVar27._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar27._12_4_ = 0xc2b0c0a5;
      auVar27._16_4_ = 0xc2b0c0a5;
      auVar27._20_4_ = 0xc2b0c0a5;
      auVar27._24_4_ = 0xc2b0c0a5;
      auVar27._28_4_ = 0xc2b0c0a5;
      auVar7 = vmaxps_avx(auVar20,auVar27);
      auVar28._8_4_ = 0x3fb8aa3b;
      auVar28._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar28._12_4_ = 0x3fb8aa3b;
      auVar28._16_4_ = 0x3fb8aa3b;
      auVar28._20_4_ = 0x3fb8aa3b;
      auVar28._24_4_ = 0x3fb8aa3b;
      auVar28._28_4_ = 0x3fb8aa3b;
      auVar17 = vfmadd213ps_fma(auVar28,auVar7,auVar42._0_32_);
      auVar19 = vroundps_avx(ZEXT1632(auVar17),1);
      auVar20 = vcmpps_avx(ZEXT1632(auVar17),auVar19,1);
      auVar20 = vandps_avx(auVar44._0_32_,auVar20);
      auVar20 = vsubps_avx(auVar19,auVar20);
      auVar35._8_4_ = 0x3f318000;
      auVar35._0_8_ = 0x3f3180003f318000;
      auVar35._12_4_ = 0x3f318000;
      auVar35._16_4_ = 0x3f318000;
      auVar35._20_4_ = 0x3f318000;
      auVar35._24_4_ = 0x3f318000;
      auVar35._28_4_ = 0x3f318000;
      auVar17 = vfmsub231ps_fma(auVar7,auVar20,auVar35);
      auVar21 = vfmsub231ps_fma(ZEXT1632(auVar17),auVar20,auVar49._0_32_);
      auVar19 = ZEXT1632(auVar21);
      auVar7._28_4_ = 0x3f318000;
      auVar7._0_28_ =
           ZEXT1628(CONCAT412(auVar21._12_4_ * auVar21._12_4_,
                              CONCAT48(auVar21._8_4_ * auVar21._8_4_,
                                       CONCAT44(auVar21._4_4_ * auVar21._4_4_,
                                                auVar21._0_4_ * auVar21._0_4_))));
      auVar17 = vfmadd213ps_fma(auVar51._0_32_,auVar19,auVar50._0_32_);
      auVar39._8_4_ = 0x3c088908;
      auVar39._0_8_ = 0x3c0889083c088908;
      auVar39._12_4_ = 0x3c088908;
      auVar39._16_4_ = 0x3c088908;
      auVar39._20_4_ = 0x3c088908;
      auVar39._24_4_ = 0x3c088908;
      auVar39._28_4_ = 0x3c088908;
      auVar17 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar19,auVar39);
      auVar40._8_4_ = 0x3d2aa9c1;
      auVar40._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar40._12_4_ = 0x3d2aa9c1;
      auVar40._16_4_ = 0x3d2aa9c1;
      auVar40._20_4_ = 0x3d2aa9c1;
      auVar40._24_4_ = 0x3d2aa9c1;
      auVar40._28_4_ = 0x3d2aa9c1;
      auVar17 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar19,auVar40);
      auVar41._8_4_ = 0x3e2aaaaa;
      auVar41._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar41._12_4_ = 0x3e2aaaaa;
      auVar41._16_4_ = 0x3e2aaaaa;
      auVar41._20_4_ = 0x3e2aaaaa;
      auVar41._24_4_ = 0x3e2aaaaa;
      auVar41._28_4_ = 0x3e2aaaaa;
      auVar19 = ZEXT1632(auVar21);
      auVar17 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar19,auVar41);
      auVar17 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar19,auVar42._0_32_);
      auVar22 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar7,auVar19);
      auVar17._0_4_ = (int)auVar20._0_4_;
      auVar17._4_4_ = (int)auVar20._4_4_;
      auVar17._8_4_ = (int)auVar20._8_4_;
      auVar17._12_4_ = (int)auVar20._12_4_;
      auVar19._16_4_ = (int)auVar20._16_4_;
      auVar19._0_16_ = auVar17;
      auVar19._20_4_ = (int)auVar20._20_4_;
      auVar19._24_4_ = (int)auVar20._24_4_;
      auVar19._28_4_ = (int)auVar20._28_4_;
      auVar21 = vpslld_avx(auVar17,0x17);
      auVar17 = vpslld_avx(auVar19._16_16_,0x17);
      auVar30._8_4_ = 0x3f800000;
      auVar30._0_8_ = 0x3f8000003f800000;
      auVar30._12_4_ = 0x3f800000;
      auVar17 = vpaddd_avx(auVar17,auVar30);
      auVar21 = vpaddd_avx(auVar21,auVar30);
      auVar20._16_16_ = auVar17;
      auVar20._0_16_ = auVar21;
      auVar29._0_4_ = auVar44._0_4_ + auVar22._0_4_;
      auVar29._4_4_ = auVar44._4_4_ + auVar22._4_4_;
      auVar29._8_4_ = auVar44._8_4_ + auVar22._8_4_;
      auVar29._12_4_ = auVar44._12_4_ + auVar22._12_4_;
      auVar29._16_4_ = auVar44._16_4_ + 0.0;
      auVar29._20_4_ = auVar44._20_4_ + 0.0;
      auVar29._24_4_ = auVar44._24_4_ + 0.0;
      auVar29._28_4_ = auVar44._28_4_ + 0.0;
      auVar17 = vfmsub213ps_fma(auVar20,auVar29,auVar44._0_32_);
      auVar20 = vmaxps_avx(*pauVar10,auVar37._0_32_);
      auVar17 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar15,auVar20);
      *pauVar10 = ZEXT1632(auVar17);
      pauVar10 = pauVar10 + 1;
      lVar11 = lVar11 + 8;
    }
    uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var3[-3]);
    auVar21._4_4_ = uVar1;
    auVar21._0_4_ = uVar1;
    auVar21._8_4_ = uVar1;
    auVar21._12_4_ = uVar1;
    for (; iVar13 + 3 < iVar12; iVar13 = iVar13 + 4) {
      auVar17 = vminps_avx(ZEXT816(0) << 0x40,*(undefined1 (*) [16])*pauVar10);
      auVar22._8_4_ = 0x42b0c0a5;
      auVar22._0_8_ = 0x42b0c0a542b0c0a5;
      auVar22._12_4_ = 0x42b0c0a5;
      auVar17 = vminps_avx(auVar17,auVar22);
      auVar23._8_4_ = 0xc2b0c0a5;
      auVar23._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar23._12_4_ = 0xc2b0c0a5;
      auVar30 = vmaxps_avx(auVar17,auVar23);
      auVar24._8_4_ = 0x3fb8aa3b;
      auVar24._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar24._12_4_ = 0x3fb8aa3b;
      auVar43._8_4_ = 0x3f000000;
      auVar43._0_8_ = 0x3f0000003f000000;
      auVar43._12_4_ = 0x3f000000;
      auVar17 = vfmadd213ps_fma(auVar24,auVar30,auVar43);
      auVar31._0_4_ = (int)auVar17._0_4_;
      auVar31._4_4_ = (int)auVar17._4_4_;
      auVar31._8_4_ = (int)auVar17._8_4_;
      auVar31._12_4_ = (int)auVar17._12_4_;
      auVar22 = vcvtdq2ps_avx(auVar31);
      auVar17 = vcmpps_avx(auVar17,auVar22,1);
      auVar38._8_4_ = 0x3f800000;
      auVar38._0_8_ = 0x3f8000003f800000;
      auVar38._12_4_ = 0x3f800000;
      auVar17 = vandps_avx(auVar17,auVar38);
      auVar17 = vsubps_avx(auVar22,auVar17);
      auVar32._8_4_ = 0x3f318000;
      auVar32._0_8_ = 0x3f3180003f318000;
      auVar32._12_4_ = 0x3f318000;
      auVar22 = vfmsub231ps_fma(auVar30,auVar17,auVar32);
      auVar33._8_4_ = 0x395e8083;
      auVar33._0_8_ = 0x395e8083395e8083;
      auVar33._12_4_ = 0x395e8083;
      auVar30 = vfmsub231ps_fma(auVar22,auVar17,auVar33);
      auVar34._0_4_ = auVar30._0_4_ * auVar30._0_4_;
      auVar34._4_4_ = auVar30._4_4_ * auVar30._4_4_;
      auVar34._8_4_ = auVar30._8_4_ * auVar30._8_4_;
      auVar34._12_4_ = auVar30._12_4_ * auVar30._12_4_;
      auVar36._8_4_ = 0x39506967;
      auVar36._0_8_ = 0x3950696739506967;
      auVar36._12_4_ = 0x39506967;
      auVar45._8_4_ = 0x3ab743ce;
      auVar45._0_8_ = 0x3ab743ce3ab743ce;
      auVar45._12_4_ = 0x3ab743ce;
      auVar22 = vfmadd213ps_fma(auVar36,auVar30,auVar45);
      auVar46._8_4_ = 0x3c088908;
      auVar46._0_8_ = 0x3c0889083c088908;
      auVar46._12_4_ = 0x3c088908;
      auVar22 = vfmadd213ps_fma(auVar22,auVar30,auVar46);
      auVar47._8_4_ = 0x3d2aa9c1;
      auVar47._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar47._12_4_ = 0x3d2aa9c1;
      auVar22 = vfmadd213ps_fma(auVar22,auVar30,auVar47);
      auVar48._8_4_ = 0x3e2aaaaa;
      auVar48._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar48._12_4_ = 0x3e2aaaaa;
      auVar22 = vfmadd213ps_fma(auVar22,auVar30,auVar48);
      auVar22 = vfmadd213ps_fma(auVar22,auVar30,auVar43);
      auVar22 = vfmadd213ps_fma(auVar22,auVar34,auVar30);
      auVar18._0_4_ = auVar22._0_4_ + 1.0;
      auVar18._4_4_ = auVar22._4_4_ + 1.0;
      auVar18._8_4_ = auVar22._8_4_ + 1.0;
      auVar18._12_4_ = auVar22._12_4_ + 1.0;
      auVar25._0_4_ = (int)auVar17._0_4_;
      auVar25._4_4_ = (int)auVar17._4_4_;
      auVar25._8_4_ = (int)auVar17._8_4_;
      auVar25._12_4_ = (int)auVar17._12_4_;
      auVar17 = vpslld_avx(auVar25,0x17);
      auVar17 = vpaddd_avx(auVar17,auVar38);
      auVar22 = vfmsub213ps_fma(auVar17,auVar18,auVar38);
      auVar17 = vmaxps_avx(ZEXT816(0) << 0x40,*(undefined1 (*) [16])*pauVar10);
      auVar17 = vfmadd213ps_fma(auVar22,auVar21,auVar17);
      *(undefined1 (*) [16])*pauVar10 = auVar17;
      pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
      lVar11 = lVar11 + 4;
    }
    lVar9 = sVar6 * sVar5 * uVar14;
    for (; (int)lVar11 < iVar12; lVar11 = lVar11 + 1) {
      __x = *(float *)((long)pvVar4 + lVar11 * 4 + lVar9);
      if (__x < 0.0) {
        uVar2 = *(uint *)(&this->field_0xd0 + (long)pp_Var3[-3]);
        auVar16._0_4_ = expf(__x);
        auVar16._4_60_ = extraout_var;
        auVar51 = ZEXT3264(CONCAT428(0x39506967,
                                     CONCAT424(0x39506967,
                                               CONCAT420(0x39506967,
                                                         CONCAT416(0x39506967,
                                                                   CONCAT412(0x39506967,
                                                                             CONCAT48(0x39506967,
                                                                                                                                                                            
                                                  0x3950696739506967)))))));
        auVar50 = ZEXT3264(CONCAT428(0x3ab743ce,
                                     CONCAT424(0x3ab743ce,
                                               CONCAT420(0x3ab743ce,
                                                         CONCAT416(0x3ab743ce,
                                                                   CONCAT412(0x3ab743ce,
                                                                             CONCAT48(0x3ab743ce,
                                                                                                                                                                            
                                                  0x3ab743ce3ab743ce)))))));
        auVar49 = ZEXT3264(CONCAT428(0x395e8083,
                                     CONCAT424(0x395e8083,
                                               CONCAT420(0x395e8083,
                                                         CONCAT416(0x395e8083,
                                                                   CONCAT412(0x395e8083,
                                                                             CONCAT48(0x395e8083,
                                                                                                                                                                            
                                                  0x395e8083395e8083)))))));
        auVar44 = ZEXT3264(CONCAT428(0x3f800000,
                                     CONCAT424(0x3f800000,
                                               CONCAT420(0x3f800000,
                                                         CONCAT416(0x3f800000,
                                                                   CONCAT412(0x3f800000,
                                                                             CONCAT48(0x3f800000,
                                                                                                                                                                            
                                                  0x3f8000003f800000)))))));
        auVar42 = ZEXT3264(CONCAT428(0x3f000000,
                                     CONCAT424(0x3f000000,
                                               CONCAT420(0x3f000000,
                                                         CONCAT416(0x3f000000,
                                                                   CONCAT412(0x3f000000,
                                                                             CONCAT48(0x3f000000,
                                                                                                                                                                            
                                                  0x3f0000003f000000)))))));
        auVar37 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar17 = vfmsub213ss_fma(auVar16._0_16_,ZEXT416(uVar2),ZEXT416(uVar2));
        *(int *)((long)pvVar4 + lVar11 * 4 + lVar9) = auVar17._0_4_;
      }
    }
  }
  return 0;
}

Assistant:

int ELU_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _mm512_storeu_ps(ptr, elu_avx512(_p, _alpha512));

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, elu_avx(_p, _alpha256));

            ptr += 8;
        }
#endif // __AVX__
        __m128 _alpha128 = _mm_set1_ps(alpha);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _mm_store_ps(ptr, elu_sse(_p, _alpha128));

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < 0.f)
                *ptr = alpha * (expf(*ptr) - 1.f);
            ptr++;
        }
    }

    return 0;
}